

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS.cpp
# Opt level: O2

NS * __thiscall NS::get_all(NS *__return_storage_ptr__,NS *this,CType *data)

{
  _Move_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
  *this_00;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
  local_40;
  
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
                     *)&local_40,
                    (_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
                     *)data);
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  this_00 = (_Move_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
             *)operator_new(0x28);
  std::__detail::__variant::
  _Move_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
  ::_Move_ctor_base(this_00,(_Move_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
                             *)&local_40);
  pcStack_50 = std::
               _Function_handler<bool_(N_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Adam-Vandervorst[P]NestedT/src/NS.cpp:23:26)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<bool_(N_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Adam-Vandervorst[P]NestedT/src/NS.cpp:23:26)>
             ::_M_manager;
  local_68._M_unused._M_object = this_00;
  get_all(__return_storage_ptr__,this,(Prep)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__detail::__variant::
  _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
  ::~_Variant_storage(&local_40);
  return __return_storage_ptr__;
}

Assistant:

NS NS::get_all(CType data) {
    return get_all((Prep)[data](N* n){return n->data == data;});
}